

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pipelines.cpp
# Opt level: O2

void pipeline_3P_SPP(size_t L,uint w)

{
  promise<void> *this;
  Node *pNVar1;
  FlowBuilder FVar2;
  array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>
  *__cur;
  long lVar3;
  size_t *psVar4;
  long *plVar5;
  pointer p_Var6;
  size_type sVar7;
  ulong uVar8;
  int iVar9;
  long lVar10;
  size_t l;
  long in_FS_OFFSET;
  bool bVar11;
  __allocator_type __a2;
  shared_ptr<tf::Topology> t;
  atomic<unsigned_long> j3;
  atomic<unsigned_long> j2;
  size_t j1;
  ulong local_5b0;
  promise<void> promise;
  anon_class_56_7_b7aa72e9 local_588;
  ulong local_550;
  ulong local_548;
  size_t cnt;
  vector<int,_std::allocator<int>_> collection3;
  vector<int,_std::allocator<int>_> collection2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  size_type local_4d8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_4d0;
  size_type local_4c8;
  Node *local_4c0;
  vector<int,_std::allocator<int>_> source;
  vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_> mybuffer;
  shared_ptr<tf::WorkerInterface> local_488;
  Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
  local_478;
  undefined8 local_298;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_290;
  mutex mutex3;
  mutex mutex2;
  Taskflow taskflow;
  Executor executor;
  
  local_488.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_488.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,(ulong)w,&local_488);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_488.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::vector<int,_std::allocator<int>_>::vector(&source,100,(allocator_type *)&local_478);
  iVar9 = 0;
  for (; source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start !=
         source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
      source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start + 1) {
    *source.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         iVar9;
    iVar9 = iVar9 + 1;
  }
  std::vector<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::vector
            (&mybuffer,L,(allocator_type *)&local_478);
  local_548 = L * 0x18;
  local_4c8 = L + 1;
  local_5b0 = 0;
  local_550 = L;
  while( true ) {
    if (100 < local_5b0) {
      std::_Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>::~_Vector_base
                (&mybuffer.
                  super__Vector_base<std::array<int,_3UL>,_std::allocator<std::array<int,_3UL>_>_>);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&source.super__Vector_base<int,_std::allocator<int>_>);
      tf::Executor::~Executor(&executor);
      return;
    }
    tf::Taskflow::Taskflow(&taskflow);
    j1 = 0;
    j2.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    j3.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    mutex2.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    mutex2.super___mutex_base._M_mutex._16_8_ = 0;
    mutex2.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    mutex2.super___mutex_base._M_mutex.__align = 0;
    mutex2.super___mutex_base._M_mutex._8_8_ = 0;
    mutex3.super___mutex_base._M_mutex._16_8_ = 0;
    mutex3.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
    mutex3.super___mutex_base._M_mutex.__align = 0;
    mutex3.super___mutex_base._M_mutex._8_8_ = 0;
    mutex3.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
    collection2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    collection2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    collection2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    collection3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    collection3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    collection3.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    cnt = 1;
    local_478._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_478._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_478._graph.
    super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    .
    super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>,_false>
    ._M_head_impl._type = PARALLEL;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>,_false>
    ._M_head_impl._callable.N = local_5b0;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>,_false>
    ._M_head_impl._callable.j3 = &j3;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>,_false>
    ._M_head_impl._callable.mutex3 = &mutex3;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>,_false>
    ._M_head_impl._callable.collection3 = &collection3;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>,_false>
    ._M_head_impl._callable.mybuffer = &mybuffer;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_false>
    ._M_head_impl._callable.N = local_5b0;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_false>
    ._M_head_impl._callable.j2 = &j2;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_false>
    ._M_head_impl._callable.mutex2 = &mutex2;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_false>
    ._M_head_impl._callable.collection2 = &collection2;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_false>
    ._M_head_impl._type = SERIAL;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_false>
    ._M_head_impl._callable.N = local_5b0;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_false>
    ._M_head_impl._callable.source = &source;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_false>
    ._M_head_impl._callable.j1 = &j1;
    local_478._meta._M_elems[0].type = SERIAL;
    local_478._meta._M_elems[1].type = PARALLEL;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>,_false>
    ._M_head_impl._callable.L = L;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_false>
    ._M_head_impl._type =
         local_478._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>,_false>
         ._M_head_impl._type;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_false>
    ._M_head_impl._callable.mybuffer =
         local_478._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>,_false>
         ._M_head_impl._callable.mybuffer;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_false>
    ._M_head_impl._callable.L = L;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_false>
    ._M_head_impl._callable.mybuffer =
         local_478._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>,_false>
         ._M_head_impl._callable.mybuffer;
    local_478._pipes.
    super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
    .
    super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_false>
    ._M_head_impl._callable.L = L;
    local_478._meta._M_elems[2].type =
         local_478._pipes.
         super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Tuple_impl<1UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Tuple_impl<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
         .
         super__Head_base<2UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>,_false>
         ._M_head_impl._type;
    if (0x555555555555555 < L) break;
    local_478._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_478._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_478._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (L == 0) {
      local_478._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
    else {
      local_478._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(local_548);
    }
    local_478._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)((long)&(local_478._lines.
                           super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                          super___atomic_base<unsigned_long>._M_i + local_548);
    local_478._lines.
    super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_478._lines.
         super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = L;
    while (bVar11 = uVar8 != 0, uVar8 = uVar8 - 1, bVar11) {
      (local_478._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[0].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      (local_478._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[1].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      (local_478._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->_M_elems[2].join_counter.
      super___atomic_base<unsigned_long>._M_i = 0;
      local_478._lines.
      super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_478._lines.
           super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    std::vector<tf::Task,_std::allocator<tf::Task>_>::vector
              (&local_478._tasks,local_4c8,(allocator_type *)&local_588);
    std::vector<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>::vector
              (&local_478._pipeflows,L,(allocator_type *)&local_588);
    std::
    queue<std::pair<unsigned_long,unsigned_long>,std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>>
    ::
    queue<std::deque<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>,void>
              (&local_478._ready_tokens);
    local_478._token_dependencies._M_h._M_buckets =
         &local_478._token_dependencies._M_h._M_single_bucket;
    local_478._token_dependencies._M_h._M_bucket_count = 1;
    local_478._token_dependencies._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_478._token_dependencies._M_h._M_element_count = 0;
    local_478._token_dependencies._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_478._token_dependencies._M_h._M_rehash_policy._M_next_resize = 0;
    local_478._token_dependencies._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_478._deferred_tokens._M_h._M_buckets = &local_478._deferred_tokens._M_h._M_single_bucket;
    local_478._deferred_tokens._M_h._M_bucket_count = 1;
    local_478._deferred_tokens._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_478._deferred_tokens._M_h._M_element_count = 0;
    local_478._deferred_tokens._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_478._longest_deferral = 0;
    local_478._deferred_tokens._M_h._M_rehash_policy._M_next_resize = 0;
    local_478._deferred_tokens._M_h._M_single_bucket = (__node_base_ptr)0x0;
    if (L == 0) {
      tf::throw_re<char_const(&)[28]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x22e,(char (*) [28])"must have at least one line");
    }
    if (local_478._pipes.
        super__Tuple_impl<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>
        .
        super__Head_base<0UL,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_false>
        ._M_head_impl._type != SERIAL) {
      tf::throw_re<char_const(&)[26]>
                ("/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp"
                 ,0x232,(char (*) [26])"first pipe must be serial");
    }
    local_478._num_tokens = 0;
    lVar10 = 0x28;
    for (uVar8 = 0;
        uVar8 < (ulong)(((long)local_478._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_478._pipeflows.
                              super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x60); uVar8 = uVar8 + 1)
    {
      *(undefined8 *)
       ((long)local_478._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar10 + -0x20) = 0;
      *(ulong *)((long)local_478._pipeflows.
                       super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                       super__Vector_impl_data._M_start + lVar10 + -0x28) = uVar8;
      *(undefined8 *)
       ((long)local_478._pipeflows.super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
              _M_impl.super__Vector_impl_data._M_start + lVar10 + -8) = 0;
      std::
      _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::clear((_Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               *)((long)&(local_478._pipeflows.
                          super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>._M_impl.
                          super__Vector_impl_data._M_start)->_line + lVar10));
      lVar10 = lVar10 + 0x60;
    }
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<const_unsigned_long,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&local_478._token_dependencies._M_h);
    std::
    _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_tf::DeferredPipeflow>,_std::allocator<std::pair<const_unsigned_long,_tf::DeferredPipeflow>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::clear(&local_478._deferred_tokens._M_h);
    (local_478._lines.
     super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
     ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
    super___atomic_base<unsigned_long>._M_i = 0;
    lVar10 = 0x20;
    for (uVar8 = 1;
        uVar8 < (ulong)(((long)local_478._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_478._pipeflows.
                              super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x60); uVar8 = uVar8 + 1)
    {
      for (lVar3 = 0; lVar3 != 2; lVar3 = lVar3 + 1) {
        *(long *)((long)&(local_478._lines.
                          super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar3].join_counter.
                         super___atomic_base<unsigned_long>._M_i + lVar10) =
             (long)(int)local_478._meta._M_elems[lVar3 + 1].type;
      }
      lVar10 = lVar10 + 0x18;
    }
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      (local_478._lines.
       super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
       ._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar10 + 1].join_counter.
      super___atomic_base<unsigned_long>._M_i = 1;
    }
    lVar10 = 0x18;
    for (uVar8 = 1;
        uVar8 < (ulong)(((long)local_478._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_478._pipeflows.
                              super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x60); uVar8 = uVar8 + 1)
    {
      *(long *)((long)&(local_478._lines.
                        super__Vector_base<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>,_std::allocator<std::array<tf::Pipeline<tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:908:38)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:920:40)>,_tf::Pipe<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_pipelines_cpp:931:40)>_>::Line,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems[0].join_counter.
                       super___atomic_base<unsigned_long>._M_i + lVar10) =
           (long)(int)local_478._meta._M_elems[0].type + -1;
      lVar10 = lVar10 + 0x18;
    }
    local_588.j1 = (size_t *)operator_new(0xd8);
    *local_588.j1 = 0;
    local_588.j1[1] = (size_t)(local_588.j1 + 3);
    local_588.j1[2] = 0;
    *(undefined1 *)(local_588.j1 + 3) = 0;
    local_588.j1[5] = 0;
    local_588.j1[6] = 0;
    local_588.j1[7] = 0;
    local_588.j1[8] = 0;
    local_588.j1[9] = (size_t)(local_588.j1 + 0xc);
    local_588.j1[10] = (size_t)(local_588.j1 + 0xc);
    local_588.j1[0xb] = (size_t)(local_588.j1 + 0x10);
    local_588.j1[0x10] = 0;
    local_588.j1[0x12] = 0;
    local_588.j1[0x11] = (size_t)&local_478;
    local_588.j1[0x14] =
         (size_t)std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
                 ::_M_invoke;
    local_588.j1[0x13] =
         (size_t)std::
                 _Function_handler<int_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:805:26)>
                 ::_M_manager;
    *(undefined1 *)(local_588.j1 + 0x18) = 4;
    local_588.j1[0x19] = 0;
    local_588.j1[0x1a] = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)&local_478,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_588);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_588);
    pNVar1 = local_478._graph.
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             .
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_588,"cond",(allocator<char> *)&local_4f8);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    (local_478._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
     super__Vector_impl_data._M_start)->_node = pNVar1;
    std::__cxx11::string::~string((string *)&local_588);
    for (uVar8 = 0; FVar2._graph = taskflow.super_FlowBuilder._graph,
        uVar8 < (ulong)(((long)local_478._pipeflows.
                               super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                        (long)local_478._pipeflows.
                              super__Vector_base<tf::Pipeflow,_std::allocator<tf::Pipeflow>_>.
                              _M_impl.super__Vector_impl_data._M_start) / 0x60); uVar8 = uVar8 + 1)
    {
      local_588.j1 = (size_t *)operator_new(0xd8);
      *local_588.j1 = 0;
      local_588.j1[1] = (size_t)(local_588.j1 + 3);
      local_588.j1[2] = 0;
      *(undefined1 *)(local_588.j1 + 3) = 0;
      local_588.j1[5] = 0;
      local_588.j1[6] = 0;
      local_588.j1[7] = 0;
      local_588.j1[8] = 0;
      local_588.j1[9] = (size_t)(local_588.j1 + 0xc);
      local_588.j1[10] = (size_t)(local_588.j1 + 0xc);
      local_588.j1[0xb] = (size_t)(local_588.j1 + 0x10);
      local_588.j1[0x10] = 0;
      local_588.j1[0x11] = (size_t)&local_478;
      local_588.j1[0x12] = uVar8;
      local_588.j1[0x14] =
           (size_t)std::
                   _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
                   ::_M_invoke;
      local_588.j1[0x13] =
           (size_t)std::
                   _Function_handler<void_(tf::Runtime_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/algorithm/pipeline.hpp:812:32)>
                   ::_M_manager;
      *(undefined1 *)(local_588.j1 + 0x18) = 2;
      local_588.j1[0x19] = 0;
      local_588.j1[0x1a] = 0;
      std::
      vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
      ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
                ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                  *)&local_478,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_588);
      std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
                ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_588);
      pNVar1 = local_478._graph.
               super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               .
               super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
               super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
               super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
      s_abi_cxx11_(&local_4f8,"rt-",3);
      std::__cxx11::to_string((string *)&promise,uVar8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_588
                     ,&local_4f8,(string *)&promise);
      std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
      local_478._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
      super__Vector_impl_data._M_start[uVar8 + 1]._node = pNVar1;
      std::__cxx11::string::~string((string *)&local_588);
      std::__cxx11::string::~string((string *)&promise);
      std::__cxx11::string::~string((string *)&local_4f8);
      tf::Task::precede<tf::Task&>
                (local_478._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 local_478._tasks.super__Vector_base<tf::Task,_std::allocator<tf::Task>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar8 + 1);
    }
    local_588.j1 = (size_t *)operator_new(0xd8);
    *local_588.j1 = 0;
    local_588.j1[1] = (size_t)(local_588.j1 + 3);
    local_588.j1[2] = 0;
    *(undefined1 *)(local_588.j1 + 3) = 0;
    local_588.j1[5] = 0;
    local_588.j1[6] = 0;
    local_588.j1[7] = 0;
    local_588.j1[8] = 0;
    local_588.j1[9] = (size_t)(local_588.j1 + 0xc);
    local_588.j1[10] = (size_t)(local_588.j1 + 0xc);
    local_588.j1[0xb] = (size_t)(local_588.j1 + 0x10);
    local_588.j1[0x10] = 0;
    local_588.j1[0x11] = (size_t)&local_478;
    *(undefined1 *)(local_588.j1 + 0x18) = 6;
    local_588.j1[0x19] = 0;
    local_588.j1[0x1a] = 0;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_588);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_588);
    pNVar1 = ((FVar2._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_588,"module_of_pipeline",(allocator<char> *)&local_4f8);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    local_4c0 = pNVar1;
    std::__cxx11::string::~string((string *)&local_588);
    FVar2 = taskflow.super_FlowBuilder;
    psVar4 = (size_t *)operator_new(0xd8);
    *psVar4 = 0;
    psVar4[1] = (size_t)(psVar4 + 3);
    psVar4[2] = 0;
    *(undefined1 *)(psVar4 + 3) = 0;
    psVar4[5] = 0;
    psVar4[6] = 0;
    psVar4[7] = 0;
    psVar4[8] = 0;
    psVar4[9] = (size_t)(psVar4 + 0xc);
    psVar4[10] = (size_t)(psVar4 + 0xc);
    psVar4[0xb] = (size_t)(psVar4 + 0x10);
    psVar4[0x10] = 0;
    psVar4[0x11] = 0;
    psVar4[0x12] = 0;
    psVar4[0x13] = 0;
    psVar4[0x14] = 0;
    plVar5 = (long *)operator_new(0x40);
    *plVar5 = (long)&j1;
    plVar5[1] = (long)&local_5b0;
    plVar5[2] = (long)&j2;
    plVar5[3] = (long)&j3;
    plVar5[4] = (long)&collection2;
    plVar5[5] = (long)&collection3;
    plVar5[6] = (long)&local_478;
    plVar5[7] = (long)&cnt;
    psVar4[0x11] = (size_t)plVar5;
    psVar4[0x14] = (size_t)std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:942:34)>
                           ::_M_invoke;
    psVar4[0x13] = (size_t)std::
                           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:942:34)>
                           ::_M_manager;
    *(undefined1 *)(psVar4 + 0x18) = 1;
    psVar4[0x19] = 0;
    psVar4[0x1a] = 0;
    local_588.j1 = psVar4;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_588);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_588);
    pNVar1 = ((FVar2._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_588,"test",(allocator<char> *)&local_4f8);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    std::__cxx11::string::~string((string *)&local_588);
    tf::Node::_precede(local_4c0,pNVar1);
    local_588.j1 = &j1;
    local_588.j2 = &j2;
    local_588.j3 = &j3;
    local_588.collection2 = &collection2;
    local_588.collection3 = &collection3;
    local_588.mybuffer = &mybuffer;
    local_588.cnt = &cnt;
    tf::Executor::_increment_topology(&executor);
    if (taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        taskflow._graph.
        super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        .
        super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pipeline_3P_SPP::anon_class_56_7_b7aa72e9::operator()(&local_588);
      std::promise<void>::promise(&promise);
      std::promise<void>::set_value(&promise);
      tf::Executor::_decrement_topology(&executor);
      std::__basic_future<void>::__basic_future((__basic_future<void> *)&t,&promise._M_future);
      L = local_550;
      local_4f8._M_dataplus._M_p =
           (pointer)t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_4f8._M_string_length =
           (size_type)
           t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4f8.field_2._M_allocated_capacity = 0;
      local_4f8.field_2._8_8_ = 0;
      local_298 = 0;
      _Stack_290._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_290);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::promise<void>::~promise(&promise);
    }
    else {
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      p_Var6 = std::
               allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
               ::allocate(&__a2,1);
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&__a2;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
      (p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_ptr_inplace_00177cf8;
      (p_Var6->_M_impl)._M_storage._M_storage.__align =
           (anon_struct_8_0_00000001_for___align)&taskflow;
      this = (promise<void> *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 8);
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = &p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::promise<void>::promise(this);
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x28) = 0;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x20) = 2;
      *(code **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x38) =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_invoke;
      *(code **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x30) =
           std::
           _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/taskflow/core/executor.hpp:2003:8)>
           ::_M_manager;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x40) = 0;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x48) = 0;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x50) = 0;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x58) = 0;
      plVar5 = (long *)operator_new(0x38);
      plVar5[6] = (long)local_588.cnt;
      plVar5[4] = (long)local_588.collection3;
      plVar5[5] = (long)local_588.mybuffer;
      plVar5[2] = (long)local_588.j3;
      plVar5[3] = (long)local_588.collection2;
      *plVar5 = (long)local_588.j1;
      plVar5[1] = (long)local_588.j2;
      *(long **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x40) = plVar5;
      *(code **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x58) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:960:33)>
           ::_M_invoke;
      *(code **)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x50) =
           std::
           _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:960:33)>
           ::_M_manager;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x60) = 0;
      *(undefined4 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x68) = 0;
      *(undefined8 *)((long)&(p_Var6->_M_impl)._M_storage._M_storage + 0x70) = 0;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)&p_Var6->_M_impl;
      t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           &p_Var6->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<tf::Topology,_std::allocator<tf::Topology>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&promise);
      std::__basic_future<void>::__basic_future
                ((__basic_future<void> *)&promise,(__state_type *)this);
      std::__weak_ptr<tf::Topology,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<tf::Topology,void>
                ((__weak_ptr<tf::Topology,(__gnu_cxx::_Lock_policy)2> *)&local_4d8,
                 &t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>);
      local_4f8._M_dataplus._M_p =
           (pointer)promise._M_future.
                    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
      local_4f8._M_string_length =
           (size_type)
           promise._M_future.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      promise._M_future.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_4f8.field_2._M_allocated_capacity = local_4d8;
      local_4f8.field_2._8_8_ = _Stack_4d0._M_pi;
      local_4d8 = 0;
      _Stack_4d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count(&_Stack_4d0);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&promise._M_future.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::mutex::lock(&taskflow._mutex);
      L = local_550;
      std::deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>::
      push_back(&taskflow._topologies.c,
                (value_type *)&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>);
      sVar7 = std::
              deque<std::shared_ptr<tf::Topology>,_std::allocator<std::shared_ptr<tf::Topology>_>_>
              ::size(&taskflow._topologies.c);
      if (sVar7 == 1) {
        tf::Executor::_set_up_topology
                  (&executor,*(Worker **)(in_FS_OFFSET + -8),
                   t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      pthread_mutex_unlock((pthread_mutex_t *)&taskflow._mutex);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&t.super___shared_ptr<tf::Topology,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::future<void>::get((future<void> *)&local_4f8);
    tf::Future<void>::~Future((Future<void> *)&local_4f8);
    tf::
    Pipeline<tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:908:38)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:920:40)>,_tf::Pipe<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_pipelines.cpp:931:40)>_>
    ::~Pipeline(&local_478);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&collection3.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&collection2.super__Vector_base<int,_std::allocator<int>_>);
    tf::Taskflow::~Taskflow(&taskflow);
    local_5b0 = local_5b0 + 1;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

void pipeline_3P_SPP(size_t L, unsigned w) {

  tf::Executor executor(w);

  const size_t maxN = 100;

  std::vector<int> source(maxN);
  std::iota(source.begin(), source.end(), 0);
  std::vector<std::array<int, 3>> mybuffer(L);

  for(size_t N = 0; N <= maxN; N++) {

    tf::Taskflow taskflow;

    size_t j1 = 0;
    std::atomic<size_t> j2 = 0;
    std::atomic<size_t> j3 = 0;
    std::mutex mutex2;
    std::mutex mutex3;
    std::vector<int> collection2;
    std::vector<int> collection3;
    size_t cnt = 1;

    tf::Pipeline pl(L,
      tf::Pipe{tf::PipeType::SERIAL, [N, &source, &j1, &mybuffer, L](auto& pf) mutable {
        if(j1 == N) {
          pf.stop();
          return;
        }
        REQUIRE(j1 == source[j1]);
        REQUIRE(pf.token() % L == pf.line());
        //*(pf.output()) = source[j1] + 1;
        mybuffer[pf.line()][pf.pipe()] = source[j1] + 1;
        j1++;
      }},

      tf::Pipe{tf::PipeType::PARALLEL, [N, &j2, &mutex2, &collection2, &mybuffer, L](auto& pf) mutable {
        REQUIRE(j2++ < N);
        //*pf.output() = *pf.input() + 1;
        {
          std::scoped_lock<std::mutex> lock(mutex2);
          REQUIRE(pf.token() % L == pf.line());
          mybuffer[pf.line()][pf.pipe()] = mybuffer[pf.line()][pf.pipe() - 1] + 1;
          collection2.push_back(mybuffer[pf.line()][pf.pipe() - 1]);
        }
      }},

      tf::Pipe{tf::PipeType::PARALLEL, [N, &j3, &mutex3, &collection3, &mybuffer, L](auto& pf) mutable {
        REQUIRE(j3++ < N);
        {
          std::scoped_lock<std::mutex> lock(mutex3);
          REQUIRE(pf.token() % L == pf.line());
          collection3.push_back(mybuffer[pf.line()][pf.pipe() - 1]);
        }
      }}
    );

    auto pipeline = taskflow.composed_of(pl).name("module_of_pipeline");
    auto test = taskflow.emplace([&](){
      REQUIRE(j1 == N);
      REQUIRE(j2 == N);
      REQUIRE(j3 == N);
      REQUIRE(collection2.size() == N);
      REQUIRE(collection3.size() == N);

      std::sort(collection2.begin(), collection2.end());
      std::sort(collection3.begin(), collection3.end());
      for (size_t i = 0; i < N; ++i) {
        REQUIRE(collection2[i] == i + 1);
        REQUIRE(collection3[i] == i + 2);
      }
      REQUIRE(pl.num_tokens() == cnt * N);
    }).name("test");

    pipeline.precede(test);

    executor.run_n(taskflow, 3, [&]() mutable {
      j1 = j2 = j3 = 0;
      collection2.clear();
      collection3.clear();
      for(size_t i = 0; i < mybuffer.size(); ++i){
        for(size_t j = 0; j < mybuffer[0].size(); ++j){
          mybuffer[i][j] = 0;
        }
      }

      cnt++;
    }).get();
  }
}